

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)30,_(unsigned_short)16>::Pack
               (uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = in[0x11];
  *out = uVar1 << 0x1e | in[0x10] & 0x3fffffff;
  uVar2 = in[0x12];
  out[1] = uVar2 << 0x1c | uVar1 >> 2 & 0xfffffff;
  out[2] = uVar2 >> 4 & 0x3ffffff;
  Unroller<(unsigned_short)30,_(unsigned_short)19>::Pack(in,out + 2);
  return;
}

Assistant:

static void Pack(const uint32_t *__restrict in, uint32_t *__restrict out) {
		pack_single_in<uint32_t, DELTA, (DELTA * OINDEX) % 32, (1U << DELTA) - 1>(in[OINDEX], out);

		Unroller<DELTA, OINDEX + 1>::Pack(in, out);
	}